

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int fileext_compare(char *test_ext,char *known_ext)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char caps [8];
  char local_30 [8];
  
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  iVar1 = strcmp(test_ext,known_ext);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if (known_ext != (char *)0x0 && test_ext != (char *)0x0) {
    sVar2 = strlen(known_ext);
    if (sVar2 < 8) {
      for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
        iVar1 = toupper((int)known_ext[sVar3]);
        local_30[sVar3] = (char)iVar1;
      }
      local_30[sVar2] = '\0';
      iVar1 = strcmp(test_ext,local_30);
    }
  }
  return iVar1;
}

Assistant:

static int fileext_compare(const char * test_ext, const char * known_ext)
{
   char caps[8] = "";
   size_t c,len;
   /* if equal, don't need to check case (store to avoid multiple calls) */
   const int cmp = strcmp(test_ext, known_ext);
   if( cmp == 0 ) return cmp;

   /* if anything odd, use default */
   if( !test_ext || !known_ext ) return cmp;

   len = strlen(known_ext);
   if( len > 7 ) return cmp;

   /* if here, strings are different but need to check upper-case */

   for(c = 0; c < len; c++ ) caps[c] = toupper((int) known_ext[c]);
   caps[c] = '\0';

   return strcmp(test_ext, caps);
}